

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

void __thiscall QTextStreamPrivate::reset(QTextStreamPrivate *this)

{
  long in_FS_OFFSET;
  QStringConverter local_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->params).realNumberPrecision = 6;
  (this->params).integerBase = 0;
  (this->params).fieldWidth = 0;
  (this->params).padChar.ucs = L' ';
  (this->params).fieldAlignment = AlignRight;
  (this->params).realNumberNotation = SmartNotation;
  (this->params).numberFlags.super_QFlagsStorageHelper<QTextStream::NumberFlag,_4>.
  super_QFlagsStorage<QTextStream::NumberFlag>.i = 0;
  this->deleteDevice = false;
  this->readBufferOffset = 0;
  this->readBufferStartDevicePos = 0;
  this->lastTokenSize = 0;
  this->hasWrittenData = false;
  this->generateBOM = false;
  this->device = (QIODevice *)0x0;
  this->string = (QString *)0x0;
  this->stringOffset = 0;
  this->stringOpenMode = (QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)0x0;
  this->encoding = Utf8;
  local_60.iface = QStringConverter::encodingInterfaces;
  local_60.state.flags.super_QFlagsStorageHelper<QStringConverter::Flag,_4>.
  super_QFlagsStorage<QStringConverter::Flag>.i =
       (QFlagsStorageHelper<QStringConverter::Flag,_4>)0x0;
  local_60.state.internalState = 0;
  local_60.state.remainingChars = 0;
  local_60.state.invalidChars = 0;
  local_60.state.field_4.d[0] = (void *)0x0;
  local_60.state.field_4.d[1] = (void *)0x0;
  local_60.state.clearFn = (ClearDataFn)0x0;
  QStringConverter::operator=(&(this->toUtf16).super_QStringConverter,&local_60);
  QStringConverter::State::clear(&local_60.state);
  local_60.iface = QStringConverter::encodingInterfaces + this->encoding;
  local_60.state.flags.super_QFlagsStorageHelper<QStringConverter::Flag,_4>.
  super_QFlagsStorage<QStringConverter::Flag>.i =
       (QFlagsStorageHelper<QStringConverter::Flag,_4>)0x0;
  local_60.state.internalState = 0;
  local_60.state.remainingChars = 0;
  local_60.state.invalidChars = 0;
  local_60.state.field_4.d[0] = (void *)0x0;
  local_60.state.field_4.d[1] = (void *)0x0;
  local_60.state.clearFn = (ClearDataFn)0x0;
  QStringConverter::operator=(&(this->fromUtf16).super_QStringConverter,&local_60);
  QStringConverter::State::clear(&local_60.state);
  this->autoDetectUnicode = true;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextStreamPrivate::reset()
{
    params.reset();

    device = nullptr;
    deleteDevice = false;
    string = nullptr;
    stringOffset = 0;
    stringOpenMode = QTextStream::NotOpen;

    readBufferOffset = 0;
    readBufferStartDevicePos = 0;
    lastTokenSize = 0;

    hasWrittenData = false;
    generateBOM = false;
    encoding = QStringConverter::Utf8;
    toUtf16 = QStringDecoder(encoding);
    fromUtf16 = QStringEncoder(encoding);
    autoDetectUnicode = true;
}